

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_server.cpp
# Opt level: O2

void __thiscall CNetServer::Drop(CNetServer *this,int ClientID,char *pReason)

{
  if (((uint)ClientID < 0x40) && (this->m_aSlots[(uint)ClientID].m_Connection.m_State != 0)) {
    if (this->m_pfnDelClient != (NETFUNC_DELCLIENT)0x0) {
      (*this->m_pfnDelClient)(ClientID,pReason,this->m_UserPtr);
    }
    CNetConnection::Disconnect(&this->m_aSlots[(uint)ClientID].m_Connection,pReason);
    this->m_NumClients = this->m_NumClients + -1;
  }
  return;
}

Assistant:

void CNetServer::Drop(int ClientID, const char *pReason)
{
	if(ClientID < 0 || ClientID >= NET_MAX_CLIENTS || m_aSlots[ClientID].m_Connection.State() == NET_CONNSTATE_OFFLINE)
		return;

	if(m_pfnDelClient)
		m_pfnDelClient(ClientID, pReason, m_UserPtr);

	m_aSlots[ClientID].m_Connection.Disconnect(pReason);
	m_NumClients--;
}